

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareMapField
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  MapFieldBase *pMVar4;
  Descriptor *pDVar5;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  undefined8 extraout_RAX;
  long lVar6;
  undefined8 *puVar7;
  anon_union_8_1_a8a14541_for_iterator_2 aVar8;
  Metadata MVar9;
  Metadata MVar10;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  FieldDescriptor *local_b0;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  local_a8;
  undefined1 local_90 [80];
  size_t local_40;
  bool local_38;
  
  bVar2 = 0;
  local_b0 = repeated_field;
  if ((repeated_field->type_ != '\v') ||
     (bVar1 = FieldDescriptor::is_map_message_type(repeated_field), !bVar1)) {
    CompareMapField((MessageDifferencer *)local_90);
    if (local_a8.
        super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  }
  MVar9 = Message::GetMetadata(message1);
  MVar10 = Message::GetMetadata(message2);
  pMVar4 = Reflection::GetMapData(MVar9.reflection,message1,repeated_field);
  bVar1 = internal::MapFieldBase::IsMapValid(pMVar4);
  if (bVar1) {
    pMVar4 = Reflection::GetMapData(MVar10.reflection,message2,repeated_field);
    bVar1 = internal::MapFieldBase::IsMapValid(pMVar4);
    if ((bVar1) && (this->reporter_ == (Reporter *)0x0)) {
      local_90._0_16_ =
           (undefined1  [16])
           absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
           ::find<google::protobuf::FieldDescriptor_const*>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::MapKeyComparator_const*>>>
                       *)&this->map_field_key_comparator_,&local_b0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::util::MessageDifferencer::MapKeyComparator_*>_>_>
                  *)&this->map_field_key_comparator_);
      local_a8.
      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bVar1 = absl::lts_20250127::container_internal::operator==
                        ((iterator *)local_90,(iterator *)&local_a8);
      if ((bVar1) &&
         ((this->repeated_field_comparison_ == AS_LIST &&
          (this->field_comparator_kind_ == kFCDefault)))) {
        pDVar5 = FieldDescriptor::message_type(local_b0);
        field = Descriptor::map_key(pDVar5);
        pDVar5 = FieldDescriptor::message_type(local_b0);
        field_00 = Descriptor::map_value(pDVar5);
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::vector(&local_a8,parent_fields);
        local_90._32_8_ = 2.12199579047121e-314;
        local_90._40_8_ = 0xffffffffffffffff;
        local_90._48_8_ = (Message *)0x0;
        local_90._56_8_ = (Message *)0x0;
        local_90._64_8_ = (MaybeInitializedPtr)0x0;
        local_90._72_8_ = (UnknownFieldSet *)0x0;
        local_40 = 0xffffffffffffffff;
        local_38 = false;
        local_90._8_8_ = message2;
        local_90._0_8_ = message1;
        local_90._16_4_ = unpacked_any;
        local_90._24_8_ = local_b0;
        if (local_a8.
            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_a8.
            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
          ::_M_realloc_insert<google::protobuf::util::MessageDifferencer::SpecificField_const&>
                    ((vector<google::protobuf::util::MessageDifferencer::SpecificField,std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>>
                      *)&local_a8,
                     (iterator)
                     local_a8.
                     super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(SpecificField *)local_90);
        }
        else {
          puVar7 = (undefined8 *)local_90;
          aVar8 = (anon_union_8_1_a8a14541_for_iterator_2)
                  local_a8.
                  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
          for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(undefined8 *)aVar8.slot_ = *puVar7;
            puVar7 = puVar7 + (ulong)bVar2 * -2 + 1;
            aVar8.slot_ = (slot_type *)((long)aVar8.slot_ + (ulong)bVar2 * -0x10 + 8);
          }
          local_a8.
          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)local_a8.
                               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0x60);
        }
        bVar3 = IsIgnored(this,message1,message2,field,&local_a8);
        bVar1 = true;
        if ((!bVar3) && (bVar3 = IsIgnored(this,message1,message2,field_00,&local_a8), !bVar3)) {
          bVar1 = CompareMapFieldByMapReflection
                            (this,message1,message2,unpacked_any,local_b0,&local_a8,
                             (this->field_comparator_).default_impl);
          field = (FieldDescriptor *)(ulong)bVar1;
          bVar1 = false;
        }
        bVar2 = (byte)field;
        if (local_a8.
            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a8.
                                super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.
                                super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar1) goto LAB_002c3354;
      }
    }
  }
  bVar2 = CompareRepeatedRep(this,message1,message2,unpacked_any,local_b0,parent_fields);
LAB_002c3354:
  return (bool)(bVar2 & 1);
}

Assistant:

bool MessageDifferencer::CompareMapField(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  ABSL_DCHECK(repeated_field->is_map());

  // the input FieldDescriptor is guaranteed to be repeated field.
  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  // When both map fields are on map, do not sync to repeated field.
  if (reflection1->GetMapData(message1, repeated_field)->IsMapValid() &&
      reflection2->GetMapData(message2, repeated_field)->IsMapValid() &&
      // TODO: Add support for reporter
      reporter_ == nullptr &&
      // Users didn't set custom map field key comparator
      map_field_key_comparator_.find(repeated_field) ==
          map_field_key_comparator_.end() &&
      // Users didn't set repeated field comparison
      repeated_field_comparison_ == AS_LIST &&
      // Users didn't set their own FieldComparator implementation
      field_comparator_kind_ == kFCDefault) {
    const FieldDescriptor* key_des = repeated_field->message_type()->map_key();
    const FieldDescriptor* val_des =
        repeated_field->message_type()->map_value();
    std::vector<SpecificField> current_parent_fields(*parent_fields);
    SpecificField specific_field;
    specific_field.message1 = &message1;
    specific_field.message2 = &message2;
    specific_field.unpacked_any = unpacked_any;
    specific_field.field = repeated_field;
    current_parent_fields.push_back(specific_field);
    if (!IsIgnored(message1, message2, key_des, current_parent_fields) &&
        !IsIgnored(message1, message2, val_des, current_parent_fields)) {
      return CompareMapFieldByMapReflection(
          message1, message2, unpacked_any, repeated_field,
          &current_parent_fields, field_comparator_.default_impl);
    }
  }

  return CompareRepeatedRep(message1, message2, unpacked_any, repeated_field,
                            parent_fields);
}